

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

size_t __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateParseAuxTable
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *descriptor;
  bool bVar1;
  CppType CVar2;
  CType CVar3;
  LogMessage *pLVar4;
  Descriptor *pDVar5;
  Descriptor *pDVar6;
  mapped_type *pmVar7;
  EnumDescriptor *this_00;
  undefined1 qualified;
  long lVar8;
  char *delim;
  long lVar9;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  size_t sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  int iVar11;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  key_type local_1c0;
  LogMessage local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  package_parts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_e8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->table_driven_ == true) {
    anon_unknown_0::SortFieldsByNumber(&ordered_fields,this->descriptor_);
    io::Printer::Print(printer,"::google::protobuf::internal::AuxillaryParseTableField(),\n");
    iVar11 = 1;
    for (lVar9 = 0; lVar9 < *(int *)(this->descriptor_ + 0x2c); lVar9 = lVar9 + 1) {
      descriptor = ordered_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar9];
      lVar8 = lVar9;
      if (*(int *)(descriptor + 0x38) < iVar11) {
        lVar8 = 0x7ae;
        internal::LogMessage::LogMessage
                  (&local_1a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x7ae);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_1a0,"CHECK failed: (field->number()) >= (last_field_number): ");
        internal::LogFinisher::operator=((LogFinisher *)&vars,pLVar4);
        internal::LogMessage::~LogMessage(&local_1a0);
      }
      for (; qualified = (undefined1)lVar8, iVar11 < *(int *)(descriptor + 0x38);
          iVar11 = iVar11 + 1) {
        io::Printer::Print(printer,"::google::protobuf::internal::AuxillaryParseTableField(),\n");
      }
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &vars._M_t._M_impl.super__Rb_tree_header._M_header;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      SetCommonFieldVariables(descriptor,&vars,&this->options_);
      CVar2 = FieldDescriptor::cpp_type(descriptor);
      if (CVar2 == CPPTYPE_ENUM) {
        this_00 = FieldDescriptor::enum_type(descriptor);
        ClassName_abi_cxx11_
                  ((string *)&local_1a0,(cpp *)this_00,(EnumDescriptor *)0x1,(bool)qualified);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"type",(allocator<char> *)&package_parts);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&vars,&local_1c0);
        std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1a0);
        io::Printer::Print(printer,&vars,
                           "{::google::protobuf::internal::AuxillaryParseTableField::enum_aux{$type$_IsValid, \"$type$\" }},\n"
                          );
LAB_0028024c:
        iVar11 = iVar11 + 1;
      }
      else {
        if (CVar2 == CPPTYPE_STRING) {
          CVar3 = EffectiveStringCType(descriptor);
          if (CVar3 - FieldOptions_CType_CORD < 2) {
            CEscape((string *)&package_parts,*(string **)(descriptor + 0xa0));
            std::operator+(&local_1c0,"\"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &package_parts);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1a0,&local_1c0,"\"");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8,"default",&local_1c2);
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&vars,&local_e8);
            std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_1c0);
            this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &package_parts;
LAB_00280152:
            std::__cxx11::string::~string((string *)this_01);
          }
          else if (CVar3 == FieldOptions_CType_STRING) {
            lVar8 = *(long *)(*(long *)(descriptor + 0xa0) + 8);
            if (lVar8 == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a0,
                         "&::google::protobuf::internal::fixed_address_empty_string",&local_1c1);
            }
            else {
              std::operator+(&local_70,"&",&this->classname_);
              std::operator+(&local_90,&local_70,"::_default_");
              FieldName_abi_cxx11_(&local_b0,(cpp *)descriptor,field_00);
              std::operator+(&local_50,&local_90,&local_b0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1a0,&local_50,"_");
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1c0,"default",(allocator<char> *)&package_parts);
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&vars,&local_1c0);
            std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_1a0);
            if (lVar8 != 0) {
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_90);
              this_01 = &local_70;
              goto LAB_00280152;
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,"full_name",(allocator<char> *)&local_1c0);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&vars,(key_type *)&local_1a0);
          std::__cxx11::string::_M_assign((string *)pmVar7);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,"strict",(allocator<char> *)&local_1c0);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&vars,(key_type *)&local_1a0);
          std::__cxx11::string::assign((char *)pmVar7);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,"type",(allocator<char> *)&local_1c0);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&vars,(key_type *)&local_1a0);
          std::__cxx11::string::_M_assign((string *)pmVar7);
          std::__cxx11::string::~string((string *)&local_1a0);
          io::Printer::Print(printer,&vars,
                             "{::google::protobuf::internal::AuxillaryParseTableField::string_aux{\n  $default$,\n  \"$full_name$\",\n  $strict$,\n  \"$type$\"\n}},\n"
                            );
          goto LAB_0028024c;
        }
        if (CVar2 == CPPTYPE_MESSAGE) {
          package_parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          package_parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          package_parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pDVar5 = FieldDescriptor::message_type(descriptor);
          do {
            pDVar6 = pDVar5;
            pDVar5 = *(Descriptor **)(pDVar6 + 0x18);
          } while (*(Descriptor **)(pDVar6 + 0x18) != (Descriptor *)0x0);
          delim = (char *)0x1;
          Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a0,*(string **)(pDVar6 + 8),".",true);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&package_parts,&local_1a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1a0);
          if (package_parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              package_parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            delim = (char *)0x7cb;
            internal::LogMessage::LogMessage
                      (&local_1a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x7cb);
            pLVar4 = internal::LogMessage::operator<<
                               (&local_1a0,"CHECK failed: (package_parts.size()) != (0): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_1c0,pLVar4);
            internal::LogMessage::~LogMessage(&local_1a0);
          }
          package_parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length = 0;
          *package_parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p = '\0';
          pDVar5 = FieldDescriptor::message_type(descriptor);
          ClassName_abi_cxx11_((string *)&local_1a0,(cpp *)pDVar5,(Descriptor *)0x0,SUB81(delim,0));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,"classname",(allocator<char> *)&local_e8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&vars,&local_1c0);
          std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1a0);
          Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)&local_1a0,(protobuf *)&package_parts,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x370fe7,delim);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,"ns",(allocator<char> *)&local_e8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&vars,&local_1c0);
          std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1a0);
          FieldMessageTypeName_abi_cxx11_((string *)&local_1a0,(cpp *)descriptor,field);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,"type",(allocator<char> *)&local_e8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&vars,&local_1c0);
          std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1a0);
          FileLevelNamespace((string *)&local_1a0,(string *)**(undefined8 **)(pDVar6 + 0x10));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,"file_namespace",(allocator<char> *)&local_e8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&vars,&local_1c0);
          std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1a0);
          io::Printer::Print(printer,&vars,
                             "{::google::protobuf::internal::AuxillaryParseTableField::message_aux{\n  &::$ns$_$classname$_default_instance_,\n"
                            );
          pDVar5 = FieldDescriptor::message_type(descriptor);
          bVar1 = anon_unknown_0::TableDrivenEnabled(pDVar5,&this->options_);
          if (bVar1) {
            io::Printer::Print(printer,&vars,
                               "  ::$ns$$file_namespace$::TableStruct::schema +\n    ::$ns$$classname$::kIndexInFileMessages,\n"
                              );
          }
          else {
            io::Printer::Print(printer,"  NULL,\n");
          }
          io::Printer::Print(printer,"}},\n");
          iVar11 = iVar11 + 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&package_parts);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars._M_t);
    }
    sVar10 = (size_t)iVar11;
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base(&ordered_fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   );
  }
  else {
    sVar10 = 0;
  }
  return sVar10;
}

Assistant:

size_t MessageGenerator::GenerateParseAuxTable(io::Printer* printer) {
  if (!table_driven_) {
    return 0;
  }

  std::vector<const FieldDescriptor*> ordered_fields =
      SortFieldsByNumber(descriptor_);

  printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
  int last_field_number = 1;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = ordered_fields[i];

    GOOGLE_CHECK_GE(field->number(), last_field_number);
    for (; last_field_number < field->number(); last_field_number++) {
      printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
    }

    std::map<string, string> vars;
    SetCommonFieldVariables(field, &vars, options_);

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_ENUM:
        vars["type"] = ClassName(field->enum_type(), true);
        printer->Print(
            vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::enum_aux{"
            "$type$_IsValid, \"$type$\" }},\n");
        last_field_number++;
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        std::vector<string> package_parts;

        const Descriptor* outer = field->message_type();
        while (outer->containing_type() != NULL) {
          outer = outer->containing_type();
        }

        package_parts = Split(
            outer->full_name(), ".", true);
        // outer->full_name() contains the class itself.  Remove it as it is
        // used in the name of the default instance variable.
        GOOGLE_DCHECK_NE(package_parts.size(), 0);
        package_parts.back().clear();

        vars["classname"] = ClassName(field->message_type(), false);
        vars["ns"] = Join(package_parts, "::");
        vars["type"] = FieldMessageTypeName(field);
        vars["file_namespace"] = FileLevelNamespace(outer->file()->name());

        printer->Print(vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::message_aux{\n"
            "  &::$ns$_$classname$_default_instance_,\n");

        bool dont_emit_table =
            !TableDrivenEnabled(field->message_type(), options_);

        if (dont_emit_table) {
          printer->Print("  NULL,\n");
        } else {
          printer->Print(vars,
              "  ::$ns$$file_namespace$::TableStruct::schema +\n"
              "    ::$ns$$classname$::kIndexInFileMessages,\n");
        }

        printer->Print("}},\n");
        last_field_number++;
        break;
      }
      case FieldDescriptor::CPPTYPE_STRING:
        switch (EffectiveStringCType(field)) {
          case FieldOptions::STRING:
            vars["default"] =
                field->default_value_string().empty()
                  ? "&::google::protobuf::internal::fixed_address_empty_string"
                  : "&" + classname_ + "::_default_" + FieldName(field) + "_";
            break;
          case FieldOptions::CORD:
          case FieldOptions::STRING_PIECE:
            vars["default"] =
                "\"" + CEscape(field->default_value_string()) + "\"";
            break;
        }
        vars["full_name"] = field->full_name();
        vars["strict"] =
          field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3
          ? "true" : "false";
        vars["type"] = field->full_name();
        printer->Print(vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::string_aux{\n"
            "  $default$,\n"
            "  \"$full_name$\",\n"
            "  $strict$,\n"
            "  \"$type$\"\n"
            "}},\n");
        last_field_number++;
        break;
      default:
        break;
    }
  }

  return last_field_number;
}